

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void new_localvar(LexState *ls,TString *name,ravi_type_map tm,TString *usertype)

{
  FuncState *fs_00;
  Dyndata *pDVar1;
  uint uVar2;
  Vardesc *pVVar3;
  int reg;
  Dyndata *dyd;
  FuncState *fs;
  TString *usertype_local;
  ravi_type_map tm_local;
  TString *name_local;
  LexState *ls_local;
  
  fs_00 = ls->fs;
  pDVar1 = ls->dyd;
  uVar2 = registerlocalvar(ls,name,tm,usertype);
  checklimit(fs_00,((pDVar1->actvar).n + 1) - fs_00->firstlocal,0x7d,"local variables");
  if ((pDVar1->actvar).size < (pDVar1->actvar).n + 2) {
    pVVar3 = (Vardesc *)
             luaM_growaux_(ls->L,(pDVar1->actvar).arr,&(pDVar1->actvar).size,2,0x7fffffff,
                           "local variables");
    (pDVar1->actvar).arr = pVVar3;
  }
  (pDVar1->actvar).arr[(pDVar1->actvar).n].idx = (short)uVar2;
  if ((ravi_parser_debug & 4U) != 0) {
    raviY_printf(fs_00,
                 "new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n",
                 fs_00->f->locvars + (int)uVar2,(ulong)uVar2,(ulong)(uint)(pDVar1->actvar).n);
  }
  (pDVar1->actvar).n = (pDVar1->actvar).n + 1;
  if ((ravi_parser_debug & 4U) != 0) {
    raviY_printf(fs_00,"new_localvar -> ls->dyd->actvar.n set to %d\n",
                 (ulong)(uint)(pDVar1->actvar).n);
  }
  return;
}

Assistant:

static void new_localvar (LexState *ls, TString *name, ravi_type_map tm, TString *usertype) {
  FuncState *fs = ls->fs;
  Dyndata *dyd = ls->dyd;
  /* register variable and get its index */
  /* RAVI change - record type info for local variable */
  int reg = registerlocalvar(ls, name, tm, usertype);
  checklimit(fs, dyd->actvar.n + 1 - fs->firstlocal,
                  MAXVARS, "local variables");
  luaM_growvector(ls->L, dyd->actvar.arr, dyd->actvar.n + 1,
                  dyd->actvar.size, Vardesc, MAX_INT, "local variables");
  /* variable will be placed at stack position dyd->actvar.n */
  dyd->actvar.arr[dyd->actvar.n].idx = cast(short, reg);
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> registering %v fs->f->locvars[%d] at ls->dyd->actvar.arr[%d]\n", &fs->f->locvars[reg], reg, dyd->actvar.n));
  dyd->actvar.n++;
  DEBUG_VARS(raviY_printf(fs, "new_localvar -> ls->dyd->actvar.n set to %d\n", dyd->actvar.n));
}